

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# types.cpp
# Opt level: O1

Am_Type_Support * Am_Find_Support(Am_Value_Type type)

{
  _Rb_tree_header *p_Var1;
  mapped_type *ppAVar2;
  Am_Type_Support *pAVar3;
  unsigned_short local_c;
  key_type_conflict local_a;
  
  if (Support_Table == (Am_Map_Support *)0x0) {
    Support_Table = (Am_Map_Support *)operator_new(0x38);
    p_Var1 = &(Support_Table->mMap)._M_t._M_impl.super__Rb_tree_header;
    (Support_Table->mMap)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
    (Support_Table->mMap)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
    (Support_Table->mMap)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
    (Support_Table->mMap)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header
    ;
    (Support_Table->mMap)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
    pAVar3 = type_type_support;
    local_a = 0x4014;
    ppAVar2 = std::
              map<unsigned_short,_Am_Type_Support_*,_std::less<unsigned_short>,_std::allocator<std::pair<const_unsigned_short,_Am_Type_Support_*>_>_>
              ::operator[]((map<unsigned_short,_Am_Type_Support_*,_std::less<unsigned_short>,_std::allocator<std::pair<const_unsigned_short,_Am_Type_Support_*>_>_>
                            *)Support_Table,&local_a);
    *ppAVar2 = pAVar3;
  }
  pAVar3 = OpenAmulet::Map<unsigned_short,_Am_Type_Support_*,_std::less<unsigned_short>_>::GetAt
                     (Support_Table,&local_c);
  return pAVar3;
}

Assistant:

Am_Type_Support *
Am_Find_Support(Am_Value_Type type)
{
  verify_support_table();
  return Support_Table->GetAt(type);
}